

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keytap2-gui.cpp
# Opt level: O0

bool renderSimilarity(TKeyPressCollection *keyPresses,TSimilarityMap *similarityMap)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  float *pfVar4;
  const_reference pvVar5;
  const_reference pvVar6;
  const_reference pvVar7;
  vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
  *in_RSI;
  vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_> *in_RDI;
  ImVec2 p1_1;
  ImVec2 p0_1;
  int i_1;
  ImVec2 p1;
  ImVec2 p0;
  float col;
  int j;
  int i;
  int hoveredId;
  ImDrawList *drawList;
  ImVec2 savePos;
  int n;
  ImVec2 wsize;
  int offsetY;
  ImGuiWindowFlags in_stack_00000274;
  bool *in_stack_00000278;
  char *in_stack_00000280;
  ImVec2 *in_stack_fffffffffffffef8;
  ImVec4 *in_stack_ffffffffffffff00;
  ImDrawList *in;
  float in_stack_ffffffffffffff08;
  ImU32 in_stack_ffffffffffffff0c;
  ImU32 col_00;
  float in_stack_ffffffffffffff10;
  float in_stack_ffffffffffffff14;
  ImDrawList *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  float _x;
  ImVec2 *this;
  ImVec2 *in_stack_ffffffffffffff30;
  ImVec2 *in_stack_ffffffffffffff38;
  ImVec2 *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  ImVec2 local_ac;
  ImVec2 local_a4;
  int local_9c;
  ImVec2 local_98;
  ImVec4 local_90;
  ImVec2 local_80;
  ImVec2 local_78;
  float local_70;
  float local_6c;
  float local_68;
  ImVec2 local_64;
  float local_5c;
  ImDrawList *local_58;
  ImVec2 local_50;
  ImVec2 local_34;
  ImVec2 local_2c;
  ImVec2 local_24;
  ImVec2 local_1c;
  int local_14;
  vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
  *local_10;
  vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_> *local_8;
  
  local_14 = (int)(stateUI.super_stStateUI.windowHeightTitleBar +
                   stateUI.super_stStateUI.windowHeightKeyPesses +
                  stateUI.super_stStateUI.windowHeightResults);
  local_10 = in_RSI;
  local_8 = in_RDI;
  ImVec2::ImVec2(&local_1c,0.0,(float)local_14);
  ImVec2::ImVec2(&local_24,0.0,0.0);
  ImGui::SetNextWindowPos
            ((ImVec2 *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
             in_stack_ffffffffffffff0c,(ImVec2 *)in_stack_ffffffffffffff00);
  ImVec2::ImVec2(&local_2c,(float)g_windowSizeX * 1.0,(float)(g_windowSizeY - local_14));
  ImGui::SetNextWindowSize
            ((ImVec2 *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
             in_stack_ffffffffffffff0c);
  bVar1 = ImGui::Begin(in_stack_00000280,in_stack_00000278,in_stack_00000274);
  if (bVar1) {
    local_34 = ImGui::GetContentRegionAvail();
    ImGui::PushItemWidth(in_stack_ffffffffffffff14);
    sVar3 = std::
            vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
            ::size(local_10);
    iVar2 = (int)sVar3;
    ImGui::SameLine((float)((ulong)in_stack_ffffffffffffff00 >> 0x20),
                    SUB84(in_stack_ffffffffffffff00,0));
    ImGui::SliderFloat((char *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                       (float *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                       (float)((ulong)in_stack_ffffffffffffff00 >> 0x20),
                       SUB84(in_stack_ffffffffffffff00,0),(char *)in_stack_fffffffffffffef8,0.0);
    ImGui::SameLine((float)((ulong)in_stack_ffffffffffffff00 >> 0x20),
                    SUB84(in_stack_ffffffffffffff00,0));
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffc0,0.0,0.0);
    bVar1 = ImGui::Button((char *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    if (bVar1) {
      pfVar4 = std::min<float>(&local_34.x,&local_34.y);
      renderSimilarity::bsize = (*pfVar4 - 24.0) / (float)iVar2;
    }
    _x = 0.0;
    ImGui::SameLine((float)((ulong)in_stack_ffffffffffffff00 >> 0x20),
                    SUB84(in_stack_ffffffffffffff00,0));
    ImGui::SliderFloat((char *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                       (float *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                       (float)((ulong)in_stack_ffffffffffffff00 >> 0x20),
                       SUB84(in_stack_ffffffffffffff00,0),(char *)in_stack_fffffffffffffef8,0.0);
    ImGui::PopItemWidth();
    this = (ImVec2 *)&stack0xffffffffffffffb8;
    ImVec2::ImVec2(this,_x,_x);
    ImGui::BeginChild((char *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                      (ImVec2 *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                      SUB81((ulong)in_stack_ffffffffffffff00 >> 0x38,0),
                      (ImGuiWindowFlags)in_stack_ffffffffffffff00);
    local_50 = ImGui::GetCursorScreenPos();
    local_58 = ImGui::GetWindowDrawList();
    local_5c = -NAN;
    if (iVar2 < 1) {
      ImVec4::ImVec4((ImVec4 *)&stack0xffffffffffffff34,1.0,0.3,0.4,1.0);
      ImGui::TextColored((ImVec4 *)&stack0xffffffffffffff34,
                         "Waiting for similarity map to be available!");
    }
    else {
      ImVec2::ImVec2(&local_64,(float)iVar2 * renderSimilarity::bsize,
                     (float)iVar2 * renderSimilarity::bsize);
      ImGui::InvisibleButton(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
      for (local_68 = 0.0; (int)local_68 < iVar2; local_68 = (float)((int)local_68 + 1)) {
        for (local_6c = 0.0; (int)local_6c < iVar2; local_6c = (float)((int)local_6c + 1)) {
          pvVar5 = std::
                   vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                   ::operator[](local_10,(long)(int)local_68);
          pvVar6 = std::vector<stMatch,_std::allocator<stMatch>_>::operator[]
                             (pvVar5,(long)(int)local_6c);
          local_70 = (float)pvVar6->cc;
          ImVec2::ImVec2(&local_78,(float)(int)local_6c * renderSimilarity::bsize + local_50.x,
                         (float)(int)local_68 * renderSimilarity::bsize + local_50.y);
          ImVec2::ImVec2(&local_80,
                         ((float)(int)((int)local_6c + 1) * renderSimilarity::bsize + local_50.x) -
                         1.0,((float)(int)((int)local_68 + 1) * renderSimilarity::bsize + local_50.y
                             ) - 1.0);
          pvVar5 = std::
                   vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                   ::operator[](local_10,(long)(int)local_68);
          pvVar6 = std::vector<stMatch,_std::allocator<stMatch>_>::operator[]
                             (pvVar5,(long)(int)local_6c);
          if ((double)renderSimilarity::threshold < pvVar6->cc) {
            in_stack_ffffffffffffff18 = local_58;
            ImVec4::ImVec4(&local_90,1.0 - local_70,local_70,0.0,local_70);
            ImGui::ColorConvertFloat4ToU32(in_stack_ffffffffffffff00);
            ImDrawList::AddRectFilled
                      ((ImDrawList *)CONCAT44(_x,in_stack_ffffffffffffff20),
                       (ImVec2 *)in_stack_ffffffffffffff18,
                       (ImVec2 *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                       in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08,
                       (ImDrawCornerFlags)((ulong)in_stack_ffffffffffffff00 >> 0x20));
          }
          ImVec2::ImVec2(&local_98,local_80.x + 1.0,local_80.y + 1.0);
          bVar1 = ImGui::IsMouseHoveringRect
                            (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                             SUB81((ulong)this >> 0x38,0));
          if (bVar1) {
            if (local_68 == local_6c) {
              local_5c = local_68;
            }
            bVar1 = ImGui::IsMouseDown((ImGuiMouseButton)((ulong)in_stack_ffffffffffffff00 >> 0x20))
            ;
            if (!bVar1) {
              ImGui::BeginTooltip();
              in_stack_ffffffffffffff10 = local_68;
              in_stack_ffffffffffffff14 = local_6c;
              pvVar5 = std::
                       vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                       ::operator[](local_10,(long)(int)local_68);
              pvVar6 = std::vector<stMatch,_std::allocator<stMatch>_>::operator[]
                                 (pvVar5,(long)(int)local_6c);
              ImGui::Text((char *)pvVar6->cc,"[%3d, %3d] = %5.4g\n",
                          (ulong)(uint)in_stack_ffffffffffffff10,
                          (ulong)(uint)in_stack_ffffffffffffff14);
              ImGui::EndTooltip();
            }
          }
        }
      }
      if (-1 < (int)local_5c) {
        for (local_9c = 0; local_9c < iVar2; local_9c = local_9c + 1) {
          pvVar7 = std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::
                   operator[](local_8,(long)local_9c);
          col_00 = pvVar7->cid;
          pvVar7 = std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::
                   operator[](local_8,(long)(int)local_5c);
          if (col_00 == pvVar7->cid) {
            ImVec2::ImVec2(&local_a4,(float)local_9c * renderSimilarity::bsize + local_50.x,
                           (float)local_9c * renderSimilarity::bsize + local_50.y);
            ImVec2::ImVec2(&local_ac,
                           ((float)(local_9c + 1) * renderSimilarity::bsize + local_50.x) - 1.0,
                           ((float)(local_9c + 1) * renderSimilarity::bsize + local_50.y) - 1.0);
            in = local_58;
            ImVec4::ImVec4((ImVec4 *)&stack0xffffffffffffff44,1.0,0.0,0.0,1.0);
            ImGui::ColorConvertFloat4ToU32((ImVec4 *)in);
            ImDrawList::AddRectFilled
                      ((ImDrawList *)CONCAT44(_x,in_stack_ffffffffffffff20),
                       (ImVec2 *)in_stack_ffffffffffffff18,
                       (ImVec2 *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                       col_00,in_stack_ffffffffffffff08,(ImDrawCornerFlags)((ulong)in >> 0x20));
          }
        }
      }
    }
    ImGui::EndChild();
    stateUI.super_stStateUI.windowHeightSimilarity = ImGui::GetWindowHeight();
  }
  else {
    stateUI.super_stStateUI.windowHeightSimilarity = ImGui::GetTextLineHeightWithSpacing();
  }
  ImGui::End();
  return false;
}

Assistant:

bool renderSimilarity(const TKeyPressCollection & keyPresses, const TSimilarityMap & similarityMap) {
    int offsetY = stateUI.windowHeightTitleBar + stateUI.windowHeightKeyPesses + stateUI.windowHeightResults;
    ImGui::SetNextWindowPos(ImVec2(0, offsetY), ImGuiCond_Always);
    ImGui::SetNextWindowSize(ImVec2(1.0f*g_windowSizeX, g_windowSizeY - offsetY), ImGuiCond_Always);
    if (ImGui::Begin("Similarity", nullptr, ImGuiWindowFlags_HorizontalScrollbar | ImGuiWindowFlags_NoMove)) {
        auto wsize = ImGui::GetContentRegionAvail();

        static float bsize = 10.0f;
        static float threshold = 0.0f;
        ImGui::PushItemWidth(100.0);

        int n = similarityMap.size();
        ImGui::SameLine();
        ImGui::SliderFloat("Size", &bsize, 1.5f, 24.0f);
        ImGui::SameLine();
        if (ImGui::Button("Fit")) {
            bsize = (std::min(wsize.x, wsize.y) - 24.0)/n;
        }
        ImGui::SameLine();
        ImGui::SliderFloat("Threshold", &threshold, 0.0f, 1.0f);
        ImGui::PopItemWidth();

        ImGui::BeginChild("Canvas", { 0, 0 }, 1, ImGuiWindowFlags_HorizontalScrollbar | ImGuiWindowFlags_AlwaysHorizontalScrollbar | ImGuiWindowFlags_AlwaysVerticalScrollbar);
        auto savePos = ImGui::GetCursorScreenPos();
        auto drawList = ImGui::GetWindowDrawList();

        int hoveredId = -1;
        if (n > 0) {
            ImGui::InvisibleButton("SimilarityMapIB", { n*bsize, n*bsize });
            for (int i = 0; i < n; ++i) {
                for (int j = 0; j < n; ++j) {
                    float col = similarityMap[i][j].cc;
                    ImVec2 p0 = {savePos.x + j*bsize, savePos.y + i*bsize};
                    ImVec2 p1 = {savePos.x + (j + 1)*bsize - 1.0f, savePos.y + (i + 1)*bsize - 1.0f};
                    if (similarityMap[i][j].cc > threshold) {
                        drawList->AddRectFilled(p0, p1, ImGui::ColorConvertFloat4ToU32(ImVec4{1.0f - col, col, 0.0f, col}));
                    }
                    if (ImGui::IsMouseHoveringRect(p0, {p1.x + 1.0f, p1.y + 1.0f})) {
                        if (i == j) hoveredId = i;
                        if (ImGui::IsMouseDown(0) == false) {
                            ImGui::BeginTooltip();
                            //ImGui::Text("[%3d, %3d]\n", keyPresses[i].cid, keyPresses[j].cid);
                            ImGui::Text("[%3d, %3d] = %5.4g\n", i, j, similarityMap[i][j].cc);
                            //for (int k = 0; k < n; ++k) {
                            //    if (similarityMap[i][k].cc > 0.5) ImGui::Text("Offset [%3d, %3d] = %d\n", i, k, (int) similarityMap[i][k].offset);
                            //}
                            //ImGui::Separator();
                            //for (int k = 0; k < n; ++k) {
                            //    if (similarityMap[k][i].cc > 0.5) ImGui::Text("Offset [%3d, %3d] = %d\n", k, i, (int) similarityMap[k][i].offset);
                            //}
                            ImGui::EndTooltip();
                        }
                    }
                }
            }

            if (hoveredId >= 0) {
                for (int i = 0; i < n; ++i) {
                    if (keyPresses[i].cid == keyPresses[hoveredId].cid) {
                        ImVec2 p0 = {savePos.x + i*bsize, savePos.y + i*bsize};
                        ImVec2 p1 = {savePos.x + (i + 1)*bsize - 1.0f, savePos.y + (i + 1)*bsize - 1.0f};
                        drawList->AddRectFilled(p0, p1, ImGui::ColorConvertFloat4ToU32({1.0f, 0.0f, 0.0f, 1.0f}));
                    }
                }
            }
        } else {
            ImGui::TextColored({1.0f, 0.3f, 0.4f, 1.0f}, "Waiting for similarity map to be available!");
        }

        ImGui::EndChild();

        stateUI.windowHeightSimilarity = ImGui::GetWindowHeight();
    } else {
        stateUI.windowHeightSimilarity = ImGui::GetTextLineHeightWithSpacing();
    }
    ImGui::End();
    return false;
}